

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_types.cpp
# Opt level: O0

vector<duckdb::TestType,_true> * duckdb::TestAllTypesFun::GetTestTypes(bool use_large_enum)

{
  interval_t interval;
  interval_t interval_00;
  initializer_list<duckdb::Value> iVar1;
  initializer_list<duckdb::Value> iVar2;
  initializer_list<duckdb::Value> iVar3;
  initializer_list<duckdb::Value> iVar4;
  initializer_list<duckdb::Value> iVar5;
  initializer_list<duckdb::Value> iVar6;
  initializer_list<duckdb::Value> iVar7;
  initializer_list<duckdb::Value> iVar8;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  iVar9;
  initializer_list<duckdb::Value> iVar10;
  initializer_list<duckdb::Value> iVar11;
  initializer_list<duckdb::Value> iVar12;
  initializer_list<duckdb::Value> iVar13;
  initializer_list<duckdb::Value> iVar14;
  initializer_list<duckdb::Value> iVar15;
  initializer_list<duckdb::Value> iVar16;
  initializer_list<duckdb::Value> iVar17;
  initializer_list<duckdb::Value> iVar18;
  initializer_list<duckdb::Value> iVar19;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  iVar20;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  iVar21;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  iVar22;
  initializer_list<duckdb::Value> iVar23;
  initializer_list<duckdb::Value> iVar24;
  initializer_list<duckdb::Value> iVar25;
  initializer_list<duckdb::Value> iVar26;
  string_t data;
  string_t data_00;
  string_t data_01;
  string_t data_02;
  string_t data_03;
  string_t data_04;
  timestamp_t value;
  timestamp_t value_00;
  timestamp_t value_01;
  timestamp_t value_02;
  timestamp_tz_t value_03;
  timestamp_tz_t value_04;
  timestamp_tz_t value_05;
  timestamp_tz_t value_06;
  date_t value_07;
  date_t value_08;
  date_t value_09;
  date_t value_10;
  byte in_SIL;
  vector<duckdb::TestType,_true> *in_RDI;
  anon_union_16_2_67f50693_for_value aVar27;
  pair<const_char_*,_duckdb::LogicalTypeId> pVar28;
  Value list_of_fixed_array_of_int_max_value;
  Value list_of_fixed_array_of_int_min_value;
  LogicalType list_of_fixed_array_of_int_type;
  Value fixed_array_of_list_of_int_max_value;
  Value fixed_array_of_list_of_int_min_value;
  LogicalType fixed_array_of_list_of_int_type;
  Value struct_of_fixed_array_max_value;
  Value struct_of_fixed_array_min_value;
  LogicalType struct_of_fixed_array_type;
  Value fixed_struct_max_array_value;
  Value fixed_struct_min_array_value;
  LogicalType fixed_struct_array_type;
  Value fixed_nested_varchar_max_array_value;
  Value fixed_nested_varchar_min_array_value;
  LogicalType fixed_nested_varchar_array_type;
  Value fixed_nested_int_max_array_value;
  Value fixed_nested_int_min_array_value;
  LogicalType fixed_nested_int_array_type;
  Value fixed_varchar_max_array_value;
  Value fixed_varchar_min_array_value;
  LogicalType fixed_varchar_array_type;
  Value fixed_int_max_array_value;
  Value fixed_int_min_array_value;
  LogicalType fixed_int_array_type;
  Value *max;
  Value *min;
  LogicalType union_type;
  child_list_t<LogicalType> members;
  Value max_map_value;
  vector<duckdb::Value,_true> map_values;
  child_list_t<Value> map_struct2;
  child_list_t<Value> map_struct1;
  Value min_map_value;
  LogicalType map_type;
  Value max_array_of_struct_val;
  Value min_array_of_struct_val;
  LogicalType array_of_structs_type;
  Value max_struct_val_list;
  child_list_t<Value> max_struct_vl_list;
  Value min_struct_val_list;
  child_list_t<Value> min_struct_vl_list;
  LogicalType struct_list_type;
  child_list_t<LogicalType> struct_list_type_list;
  Value max_struct_val;
  child_list_t<Value> max_struct_list;
  Value min_struct_val;
  child_list_t<Value> min_struct_list;
  LogicalType struct_type;
  child_list_t<LogicalType> struct_type_list;
  Value nested_int_list;
  Value empty_nested_list;
  LogicalType nested_list_type;
  Value varchar_list;
  Value empty_varchar_list;
  LogicalType varchar_list_type;
  Value timestamptz_list;
  Value empty_timestamptz_list;
  LogicalType timestamptz_list_type;
  Value timestamp_list;
  Value empty_timestamp_list;
  LogicalType timestamp_list_type;
  Value date_list;
  Value empty_date_list;
  LogicalType date_list_type;
  Value double_list;
  Value empty_double_list;
  LogicalType double_list_type;
  Value int_list;
  Value empty_int_list;
  LogicalType int_list_type;
  string_t *large_enum_ptr_1;
  Vector large_enum_1;
  idx_t i_1;
  string_t *large_enum_ptr;
  Vector large_enum;
  idx_t i;
  string_t *medium_enum_ptr;
  Vector medium_enum;
  string_t *small_enum_ptr;
  Vector small_enum;
  interval_t max_interval;
  interval_t min_interval;
  vector<duckdb::TestType,_true> *result;
  value_type *in_stack_ffffffffffffb0e8;
  undefined7 in_stack_ffffffffffffb0f0;
  undefined1 in_stack_ffffffffffffb0f7;
  Vector *in_stack_ffffffffffffb0f8;
  Vector *in_stack_ffffffffffffb100;
  undefined4 in_stack_ffffffffffffb108;
  int32_t in_stack_ffffffffffffb10c;
  LogicalTypeId id;
  Value *in_stack_ffffffffffffb110;
  pair<const_char_*,_duckdb::Value> *in_stack_ffffffffffffb118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  *in_stack_ffffffffffffb120;
  undefined4 in_stack_ffffffffffffb128;
  undefined2 in_stack_ffffffffffffb12c;
  int16_t in_stack_ffffffffffffb12e;
  Vector *in_stack_ffffffffffffb130;
  undefined4 in_stack_ffffffffffffb138;
  undefined2 in_stack_ffffffffffffb13c;
  uint8_t in_stack_ffffffffffffb13e;
  uint8_t in_stack_ffffffffffffb13f;
  Value *in_stack_ffffffffffffb140;
  LogicalType *in_stack_ffffffffffffb160;
  string *in_stack_ffffffffffffb168;
  Value *in_stack_ffffffffffffb170;
  optional_idx in_stack_ffffffffffffb178;
  child_list_t<LogicalType> *in_stack_ffffffffffffb198;
  vector<duckdb::Value,_true> *in_stack_ffffffffffffb1c0;
  LogicalType *in_stack_ffffffffffffb1c8;
  vector<duckdb::Value,_true> *in_stack_ffffffffffffb1d0;
  LogicalType *in_stack_ffffffffffffb1d8;
  child_list_t<Value> *in_stack_ffffffffffffb1f8;
  Value *in_stack_ffffffffffffb208;
  uint8_t in_stack_ffffffffffffb217;
  child_list_t<LogicalType> *in_stack_ffffffffffffb218;
  vector<duckdb::Value,_true> *in_stack_ffffffffffffb230;
  LogicalType *in_stack_ffffffffffffb238;
  undefined8 **local_4af0;
  undefined8 **local_4ad0;
  undefined8 **local_4ab0;
  undefined8 **local_4a90;
  undefined8 **local_4a70;
  undefined8 **local_4a50;
  undefined8 **local_4a30;
  undefined8 **local_4a10;
  undefined8 **local_49f0;
  undefined8 **local_49d0;
  undefined8 **local_49b0;
  undefined8 **local_4988;
  undefined8 **local_4968;
  undefined8 **local_4940;
  undefined8 **local_4920;
  undefined8 **local_48f8;
  undefined8 **local_48d8;
  undefined8 **local_48b8;
  undefined8 **local_4880;
  undefined8 **local_4810;
  undefined8 **local_47e0;
  undefined8 **local_47b0;
  undefined8 **local_4748;
  undefined8 **local_46e0;
  undefined8 **local_4678;
  undefined8 **local_4638;
  undefined8 *local_4528 [24];
  undefined1 **local_4468;
  undefined8 local_4460;
  undefined1 **local_43f8;
  undefined8 *local_43f0 [8];
  undefined1 local_43b0 [64];
  undefined1 local_4370 [64];
  undefined1 **local_4330;
  undefined8 local_4328;
  undefined1 **local_42a8;
  undefined8 *local_42a0 [8];
  undefined1 local_4260 [64];
  undefined1 local_4220 [64];
  undefined1 **local_41e0;
  undefined8 local_41d8;
  undefined1 **local_4170;
  undefined8 *local_4168 [8];
  undefined1 local_4128 [64];
  undefined1 local_40e8 [64];
  undefined1 **local_40a8;
  undefined8 local_40a0;
  undefined1 **local_4018;
  undefined8 *local_4010 [12];
  undefined1 local_3fb0 [96];
  undefined1 **local_3f50;
  undefined8 local_3f48;
  undefined1 **local_3ee0;
  undefined8 *local_3ed8 [12];
  undefined1 local_3e78 [96];
  undefined1 **local_3e18;
  undefined8 local_3e10;
  undefined1 **local_3da8;
  undefined8 *local_3da0 [7];
  undefined1 local_3d68 [56];
  undefined1 **local_3d30;
  undefined8 local_3d28;
  undefined1 **local_3ce8;
  undefined8 *local_3ce0 [8];
  undefined1 local_3ca0 [64];
  undefined1 local_3c60 [64];
  undefined1 **local_3c20;
  undefined8 local_3c18;
  undefined1 **local_3bb0;
  undefined8 *local_3ba8 [8];
  undefined1 local_3b68 [64];
  undefined1 local_3b28 [64];
  undefined1 **local_3ae8;
  undefined8 local_3ae0;
  undefined1 **local_3a58;
  undefined8 *local_3a50 [8];
  undefined1 local_3a10 [64];
  undefined1 local_39d0 [64];
  undefined1 **local_3990;
  undefined8 local_3988;
  undefined1 local_3921;
  undefined1 **local_3908;
  undefined8 *local_3900 [8];
  undefined1 local_38c0 [64];
  undefined1 local_3880 [64];
  undefined1 **local_3840;
  undefined8 local_3838;
  undefined1 **local_37b0;
  undefined8 *local_37a8 [8];
  undefined1 local_3768 [64];
  undefined1 local_3728 [64];
  undefined1 **local_36e8;
  undefined8 local_36e0;
  undefined1 local_3679;
  undefined1 **local_3660;
  undefined8 *local_3658 [8];
  undefined1 local_3618 [64];
  undefined1 local_35d8 [64];
  undefined1 **local_3598;
  undefined8 local_3590;
  undefined1 **local_3508;
  undefined8 *local_3500 [8];
  undefined1 local_34c0 [64];
  undefined1 local_3480 [64];
  undefined1 **local_3440;
  undefined8 local_3438;
  undefined1 local_33b9;
  undefined1 **local_33a0;
  undefined8 *local_3398 [8];
  undefined1 local_3358 [64];
  undefined1 local_3318 [64];
  undefined1 **local_32d8;
  undefined8 local_32d0;
  undefined1 **local_3218;
  undefined8 *local_3210 [8];
  undefined1 local_31d0 [64];
  undefined1 local_3190 [64];
  undefined1 **local_3150;
  undefined8 local_3148;
  undefined1 local_30c9;
  undefined1 **local_30b0;
  undefined8 *local_30a8 [8];
  undefined1 local_3068 [64];
  undefined1 local_3028 [64];
  undefined1 **local_2fe8;
  undefined8 local_2fe0;
  undefined1 local_2ed8 [64];
  undefined1 *local_2e98;
  undefined1 local_2e38 [64];
  undefined1 *local_2df8;
  undefined1 **local_2db8;
  undefined8 *local_2db0 [7];
  undefined1 local_2d78 [56];
  undefined1 **local_2d40;
  undefined8 local_2d38;
  undefined8 local_2828;
  undefined8 uStack_2820;
  undefined8 local_2818;
  undefined1 local_2781;
  undefined1 **local_2768;
  undefined8 *local_2760 [8];
  undefined1 local_2720 [64];
  undefined1 local_26e0 [64];
  undefined1 **local_26a0;
  undefined8 local_2698;
  undefined8 local_2638;
  undefined8 uStack_2630;
  undefined8 local_2628;
  char *local_1bc0;
  LogicalTypeId local_1bb8;
  char *local_1bb0;
  LogicalTypeId local_1ba8;
  char *local_1b68;
  LogicalTypeId local_1b60;
  char *local_1b58;
  LogicalTypeId local_1b50;
  undefined1 local_1af1;
  undefined1 **local_1ad8;
  undefined8 *local_1ad0 [8];
  undefined1 local_1a90 [64];
  undefined1 local_1a50 [64];
  undefined1 local_1a10 [64];
  undefined1 local_19d0 [64];
  undefined1 **local_1990;
  undefined8 local_1988;
  undefined8 local_1928;
  undefined8 uStack_1920;
  undefined8 local_1918;
  undefined1 local_18a9;
  undefined1 **local_1890;
  undefined8 *local_1888 [8];
  undefined1 local_1848 [64];
  undefined1 local_1808 [64];
  undefined1 local_17c8 [64];
  undefined1 **local_1788;
  undefined8 local_1780;
  undefined8 local_1708;
  undefined8 uStack_1700;
  undefined8 local_16f8;
  undefined1 local_1662;
  allocator local_1661;
  string local_1660 [32];
  int64_t local_1640;
  timestamp_tz_t local_1638 [4];
  int64_t local_1618;
  timestamp_tz_t local_1610;
  int64_t local_1608;
  timestamp_tz_t local_1600;
  undefined8 local_15f8;
  undefined1 **local_15f0;
  undefined8 *local_15e8 [8];
  undefined1 local_15a8 [64];
  undefined1 local_1568 [64];
  undefined1 local_1528 [64];
  undefined1 local_14e8 [64];
  undefined1 **local_14a8;
  undefined8 local_14a0;
  undefined8 local_1428;
  undefined8 uStack_1420;
  undefined8 local_1418;
  undefined1 local_137a;
  allocator local_1379;
  string local_1378 [32];
  int64_t local_1358;
  int64_t local_1338;
  int64_t local_1330;
  undefined8 local_1328;
  undefined1 **local_1320;
  undefined8 *local_1318 [8];
  undefined1 local_12d8 [64];
  undefined1 local_1298 [64];
  undefined1 local_1258 [64];
  undefined1 local_1218 [64];
  undefined1 **local_11d8;
  undefined8 local_11d0;
  undefined8 local_1158;
  undefined8 uStack_1150;
  undefined8 local_1148;
  undefined1 local_10b2;
  allocator local_10b1;
  string local_10b0 [36];
  int32_t local_108c;
  int32_t local_106c;
  int32_t local_1068;
  undefined4 local_1064;
  undefined1 **local_1060;
  undefined8 *local_1058 [8];
  undefined1 local_1018 [64];
  undefined1 local_fd8 [64];
  undefined1 local_f98 [64];
  undefined1 local_f58 [64];
  undefined1 **local_f18;
  undefined8 local_f10;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined1 local_de9;
  undefined1 **local_dd0;
  undefined8 *local_dc8 [8];
  undefined1 local_d88 [64];
  undefined1 local_d48 [64];
  undefined1 local_d08 [64];
  undefined1 local_cc8 [64];
  undefined1 local_c88 [64];
  undefined1 **local_c48;
  undefined8 local_c40;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined1 local_b21;
  undefined1 **local_af0;
  undefined8 *local_ae8 [8];
  undefined1 local_aa8 [64];
  undefined1 local_a68 [64];
  undefined1 local_a28 [64];
  undefined1 local_9e8 [64];
  undefined1 **local_9a8;
  undefined8 local_9a0;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 local_918;
  string local_868 [39];
  allocator local_841;
  string local_840 [32];
  string local_820 [48];
  anon_struct_16_3_d7536bce_for_pointer local_7f0;
  string local_7e0 [39];
  allocator local_7b9;
  string local_7b8 [32];
  string local_798 [48];
  anon_union_16_2_67f50693_for_value local_768;
  anon_union_16_2_67f50693_for_value *local_758;
  string local_6b8 [39];
  allocator local_691;
  string local_690 [32];
  string local_670 [48];
  anon_union_16_2_67f50693_for_value local_640;
  ulong local_630;
  string_t *local_628;
  string local_588 [39];
  allocator local_561;
  string local_560 [32];
  string local_540 [48];
  anon_union_16_2_67f50693_for_value local_510;
  ulong local_500;
  string_t *local_4f8;
  anon_struct_16_3_d7536bce_for_pointer local_448;
  anon_union_16_2_67f50693_for_value local_428;
  anon_union_16_2_67f50693_for_value *local_418;
  allocator local_389;
  string local_388 [103];
  allocator local_321;
  string local_320 [103];
  allocator local_2b9;
  string local_2b8 [103];
  allocator local_251;
  string local_250 [103];
  allocator local_1e9;
  string local_1e8 [160];
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined8 uStack_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined8 uStack_88;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_a = 0;
  vector<duckdb::TestType,_true>::vector((vector<duckdb::TestType,_true> *)0x141f89b);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [5])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [8])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [9])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[4]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [4])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[7]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [7])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [8])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [9])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [9])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[10]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [10])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [5])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [8])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[7]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [7])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [5])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [5])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[10]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [10])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[12]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [12])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[13]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [13])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[13]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [13])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [8])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[13]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [13])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[6]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [6])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[7]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [7])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::DECIMAL(in_stack_ffffffffffffb13f,in_stack_ffffffffffffb13e);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[8]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8,
             (char (*) [8])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x141fb5d);
  LogicalType::DECIMAL(in_stack_ffffffffffffb13f,in_stack_ffffffffffffb13e);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[8]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8,
             (char (*) [8])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x141fba1);
  LogicalType::DECIMAL(in_stack_ffffffffffffb13f,in_stack_ffffffffffffb13e);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[9]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8,
             (char (*) [9])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x141fbe5);
  LogicalType::DECIMAL(in_stack_ffffffffffffb13f,in_stack_ffffffffffffb13e);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[9]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8,
             (char (*) [9])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x141fc29);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,&in_stack_ffffffffffffb0f8->vector_type,
             (char (*) [5])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  local_90 = 0;
  uStack_8c = 0;
  uStack_88 = 0;
  local_a0 = 999;
  uStack_9c = 999;
  uStack_98 = 999999999;
  local_f8 = 0;
  uStack_f0 = 0;
  interval.days._3_1_ = in_stack_ffffffffffffb0f7;
  interval._0_7_ = in_stack_ffffffffffffb0f0;
  interval.micros = (int64_t)in_stack_ffffffffffffb0f8;
  Value::INTERVAL(interval);
  local_148 = CONCAT44(uStack_9c,local_a0);
  uStack_140 = uStack_98;
  interval_00.days._3_1_ = in_stack_ffffffffffffb0f7;
  interval_00._0_7_ = in_stack_ffffffffffffb0f0;
  interval_00.micros = (int64_t)in_stack_ffffffffffffb0f8;
  Value::INTERVAL(interval_00);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalTypeId *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [9])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1e8,"goo",6,&local_1e9);
  Value::Value(in_stack_ffffffffffffb170,in_stack_ffffffffffffb168);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalTypeId *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [8])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::__cxx11::string::~string(local_1e8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_250,"thisisalongblob\\x00withnullbytes",&local_251);
  Value::BLOB(in_stack_ffffffffffffb168);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_2b8,"\\x00\\x00\\x00a",&local_2b9);
  Value::BLOB(in_stack_ffffffffffffb168);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalTypeId *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [5])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::__cxx11::string::~string(local_2b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::__cxx11::string::~string(local_250);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_320,"0010001001011100010101011010111",&local_321);
  Value::BIT(in_stack_ffffffffffffb168);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_388,"10101",&local_389);
  Value::BIT(in_stack_ffffffffffffb168);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[4],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalTypeId *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [4])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::__cxx11::string::~string(local_388);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_389);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::__cxx11::string::~string(local_320);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_321);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Vector::Vector(in_stack_ffffffffffffb130,
                 (LogicalType *)
                 CONCAT26(in_stack_ffffffffffffb12e,
                          CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
                 (idx_t)in_stack_ffffffffffffb120);
  LogicalType::~LogicalType((LogicalType *)0x1420050);
  local_418 = &FlatVector::GetData<duckdb::string_t>((Vector *)0x142005d)->value;
  string_t::string_t((string_t *)in_stack_ffffffffffffb100,(char *)in_stack_ffffffffffffb0f8);
  data.value._4_1_ = (char)in_stack_ffffffffffffb10c;
  data.value._5_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 8);
  data.value._6_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x10);
  data.value._7_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x18);
  data.value.pointer.length = in_stack_ffffffffffffb108;
  data.value.pointer.ptr = (char *)in_stack_ffffffffffffb110;
  local_428.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::AddStringOrBlob(in_stack_ffffffffffffb100,data);
  local_418->pointer = (anon_struct_16_3_d7536bce_for_pointer)local_428;
  string_t::string_t((string_t *)in_stack_ffffffffffffb100,(char *)in_stack_ffffffffffffb0f8);
  data_00.value._4_1_ = (char)in_stack_ffffffffffffb10c;
  data_00.value._5_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 8);
  data_00.value._6_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x10);
  data_00.value._7_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x18);
  data_00.value.pointer.length = in_stack_ffffffffffffb108;
  data_00.value.pointer.ptr = (char *)in_stack_ffffffffffffb110;
  local_448 = (anon_struct_16_3_d7536bce_for_pointer)
              StringVector::AddStringOrBlob(in_stack_ffffffffffffb100,data_00);
  local_418[1].pointer = local_448;
  LogicalType::ENUM(in_stack_ffffffffffffb0f8,
                    CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[11]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8,
             (char (*) [11])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14201af);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Vector::Vector(in_stack_ffffffffffffb130,
                 (LogicalType *)
                 CONCAT26(in_stack_ffffffffffffb12e,
                          CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
                 (idx_t)in_stack_ffffffffffffb120);
  LogicalType::~LogicalType((LogicalType *)0x14201ec);
  local_4f8 = FlatVector::GetData<duckdb::string_t>((Vector *)0x14201f9);
  for (local_500 = 0; local_500 < 300; local_500 = local_500 + 1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_560,"enum_",&local_561);
    ::std::__cxx11::to_string
              (CONCAT26(in_stack_ffffffffffffb12e,
                        CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_ffffffffffffb12e,
                              CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
                     &in_stack_ffffffffffffb120->first);
    string_t::string_t((string_t *)in_stack_ffffffffffffb100,(string *)in_stack_ffffffffffffb0f8);
    data_01.value._4_1_ = (char)in_stack_ffffffffffffb10c;
    data_01.value._5_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 8);
    data_01.value._6_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x10);
    data_01.value._7_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x18);
    data_01.value.pointer.length = in_stack_ffffffffffffb108;
    data_01.value.pointer.ptr = (char *)in_stack_ffffffffffffb110;
    aVar27.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::AddStringOrBlob(in_stack_ffffffffffffb100,data_01);
    local_4f8[local_500].value.pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar27;
    local_510.pointer = aVar27.pointer;
    ::std::__cxx11::string::~string(local_540);
    ::std::__cxx11::string::~string(local_588);
    ::std::__cxx11::string::~string(local_560);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_561);
  }
  LogicalType::ENUM(in_stack_ffffffffffffb0f8,
                    CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[12]>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8,
             (char (*) [12])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14207ec);
  id = (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18);
  if ((local_9 & 1) == 0) {
    LogicalType::LogicalType(&in_stack_ffffffffffffb110->type_,id);
    Vector::Vector(in_stack_ffffffffffffb130,
                   (LogicalType *)
                   CONCAT26(in_stack_ffffffffffffb12e,
                            CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
                   (idx_t)in_stack_ffffffffffffb120);
    LogicalType::~LogicalType((LogicalType *)0x1420b80);
    local_758 = &FlatVector::GetData<duckdb::string_t>((Vector *)0x1420b8d)->value;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_7b8,"enum_",&local_7b9);
    ::std::__cxx11::to_string
              (CONCAT13(in_stack_ffffffffffffb13f,
                        CONCAT12(in_stack_ffffffffffffb13e,in_stack_ffffffffffffb13c)));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_ffffffffffffb12e,
                              CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
                     &in_stack_ffffffffffffb120->first);
    string_t::string_t((string_t *)in_stack_ffffffffffffb100,(string *)in_stack_ffffffffffffb0f8);
    data_03.value._4_1_ = (char)in_stack_ffffffffffffb10c;
    data_03.value._5_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 8);
    data_03.value._6_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x10);
    data_03.value._7_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x18);
    data_03.value.pointer.length = in_stack_ffffffffffffb108;
    data_03.value.pointer.ptr = (char *)in_stack_ffffffffffffb110;
    local_768.pointer =
         (anon_struct_16_3_d7536bce_for_pointer)
         StringVector::AddStringOrBlob(in_stack_ffffffffffffb100,data_03);
    local_758->pointer = (anon_struct_16_3_d7536bce_for_pointer)local_768;
    ::std::__cxx11::string::~string(local_798);
    ::std::__cxx11::string::~string(local_7e0);
    ::std::__cxx11::string::~string(local_7b8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_840,"enum_",&local_841);
    ::std::__cxx11::to_string
              (CONCAT13(in_stack_ffffffffffffb13f,
                        CONCAT12(in_stack_ffffffffffffb13e,in_stack_ffffffffffffb13c)));
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT26(in_stack_ffffffffffffb12e,
                              CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
                     &in_stack_ffffffffffffb120->first);
    string_t::string_t((string_t *)in_stack_ffffffffffffb100,(string *)in_stack_ffffffffffffb0f8);
    data_04.value._4_1_ = (char)in_stack_ffffffffffffb10c;
    data_04.value._5_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 8);
    data_04.value._6_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x10);
    data_04.value._7_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x18);
    data_04.value.pointer.length = in_stack_ffffffffffffb108;
    data_04.value.pointer.ptr = (char *)in_stack_ffffffffffffb110;
    local_7f0 = (anon_struct_16_3_d7536bce_for_pointer)
                StringVector::AddStringOrBlob(in_stack_ffffffffffffb100,data_04);
    local_758[1].pointer = local_7f0;
    ::std::__cxx11::string::~string(local_820);
    ::std::__cxx11::string::~string(local_868);
    ::std::__cxx11::string::~string(local_840);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_841);
    LogicalType::ENUM(in_stack_ffffffffffffb0f8,
                      CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
    ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
    emplace_back<duckdb::LogicalType,char_const(&)[11]>
              ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
               in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8,
               (char (*) [11])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
    LogicalType::~LogicalType((LogicalType *)0x1420e12);
    Vector::~Vector((Vector *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  }
  else {
    LogicalType::LogicalType(&in_stack_ffffffffffffb110->type_,id);
    Vector::Vector(in_stack_ffffffffffffb130,
                   (LogicalType *)
                   CONCAT26(in_stack_ffffffffffffb12e,
                            CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
                   (idx_t)in_stack_ffffffffffffb120);
    LogicalType::~LogicalType((LogicalType *)0x1420837);
    local_628 = FlatVector::GetData<duckdb::string_t>((Vector *)0x1420844);
    for (local_630 = 0; local_630 < 70000; local_630 = local_630 + 1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_690,"enum_",&local_691);
      ::std::__cxx11::to_string
                (CONCAT26(in_stack_ffffffffffffb12e,
                          CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT26(in_stack_ffffffffffffb12e,
                                CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
                       &in_stack_ffffffffffffb120->first);
      string_t::string_t((string_t *)in_stack_ffffffffffffb100,(string *)in_stack_ffffffffffffb0f8);
      data_02.value._4_1_ = (char)in_stack_ffffffffffffb10c;
      data_02.value._5_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 8);
      data_02.value._6_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x10);
      data_02.value._7_1_ = (char)((uint)in_stack_ffffffffffffb10c >> 0x18);
      data_02.value.pointer.length = in_stack_ffffffffffffb108;
      data_02.value.pointer.ptr = (char *)in_stack_ffffffffffffb110;
      aVar27.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob(in_stack_ffffffffffffb100,data_02);
      local_628[local_630].value.pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar27;
      local_640.pointer = aVar27.pointer;
      ::std::__cxx11::string::~string(local_670);
      ::std::__cxx11::string::~string(local_6b8);
      ::std::__cxx11::string::~string(local_690);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_691);
    }
    LogicalType::ENUM(in_stack_ffffffffffffb0f8,
                      CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
    ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
    emplace_back<duckdb::LogicalType,char_const(&)[11]>
              ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
               in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8,
               (char (*) [11])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
    LogicalType::~LogicalType((LogicalType *)0x1420afe);
    Vector::~Vector((Vector *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  }
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  LogicalType::LIST((LogicalType *)
                    CONCAT17(in_stack_ffffffffffffb13f,
                             CONCAT16(in_stack_ffffffffffffb13e,
                                      CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138))
                            ));
  LogicalType::~LogicalType((LogicalType *)0x1420fe9);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_928 = 0;
  uStack_920 = 0;
  local_918 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1421029);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1421055);
  LogicalType::~LogicalType((LogicalType *)0x1421062);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_b21 = 1;
  local_af0 = (undefined1 **)local_ae8;
  Value::INTEGER(CONCAT22(in_stack_ffffffffffffb12e,in_stack_ffffffffffffb12c));
  local_af0 = (undefined1 **)local_aa8;
  Value::INTEGER(CONCAT22(in_stack_ffffffffffffb12e,in_stack_ffffffffffffb12c));
  local_af0 = (undefined1 **)local_a68;
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_af0 = (undefined1 **)local_a28;
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_af0 = (undefined1 **)local_9e8;
  Value::INTEGER(CONCAT22(in_stack_ffffffffffffb12e,in_stack_ffffffffffffb12c));
  local_b21 = 0;
  local_9a8 = (undefined1 **)local_ae8;
  local_9a0 = 5;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1421191);
  iVar1._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar1._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar1,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14211e4);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x14211f1);
  local_4638 = &local_9a8;
  do {
    local_4638 = local_4638 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4638 != local_ae8);
  LogicalType::~LogicalType((LogicalType *)0x1421252);
  LogicalType::~LogicalType((LogicalType *)0x142125f);
  LogicalType::~LogicalType((LogicalType *)0x142126c);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[10],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [10])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  LogicalType::LIST((LogicalType *)
                    CONCAT17(in_stack_ffffffffffffb13f,
                             CONCAT16(in_stack_ffffffffffffb13e,
                                      CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138))
                            ));
  LogicalType::~LogicalType((LogicalType *)0x14212d2);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_bc8 = 0;
  uStack_bc0 = 0;
  local_bb8 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1421312);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x142133e);
  LogicalType::~LogicalType((LogicalType *)0x142134b);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_de9 = 1;
  local_dd0 = (undefined1 **)local_dc8;
  Value::DOUBLE((double)CONCAT26(in_stack_ffffffffffffb12e,
                                 CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  local_dd0 = (undefined1 **)local_d88;
  Value::DOUBLE((double)CONCAT26(in_stack_ffffffffffffb12e,
                                 CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  local_dd0 = (undefined1 **)local_d48;
  ::std::numeric_limits<double>::infinity();
  Value::DOUBLE((double)CONCAT26(in_stack_ffffffffffffb12e,
                                 CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  local_dd0 = (undefined1 **)local_d08;
  ::std::numeric_limits<double>::infinity();
  Value::DOUBLE((double)CONCAT26(in_stack_ffffffffffffb12e,
                                 CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  local_dd0 = (undefined1 **)local_cc8;
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_dd0 = (undefined1 **)local_c88;
  Value::DOUBLE((double)CONCAT26(in_stack_ffffffffffffb12e,
                                 CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  local_de9 = 0;
  local_c48 = (undefined1 **)local_dc8;
  local_c40 = 6;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x14214a3);
  iVar2._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar2._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar2,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14214f6);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1421503);
  local_4678 = &local_c48;
  do {
    local_4678 = local_4678 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4678 != local_dc8);
  LogicalType::~LogicalType((LogicalType *)0x1421564);
  LogicalType::~LogicalType((LogicalType *)0x1421571);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[13],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [13])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  LogicalType::LIST((LogicalType *)
                    CONCAT17(in_stack_ffffffffffffb13f,
                             CONCAT16(in_stack_ffffffffffffb13e,
                                      CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138))
                            ));
  LogicalType::~LogicalType((LogicalType *)0x14215d7);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_e98 = 0;
  uStack_e90 = 0;
  local_e88 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1421617);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1421643);
  LogicalType::~LogicalType((LogicalType *)0x1421650);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_10b2 = 1;
  local_1060 = (undefined1 **)local_1058;
  local_1064 = 0;
  value_07.days._2_2_ = in_stack_ffffffffffffb12e;
  value_07.days._0_2_ = in_stack_ffffffffffffb12c;
  Value::DATE(value_07);
  local_1060 = (undefined1 **)local_1018;
  local_1068 = (int32_t)date_t::infinity();
  value_08.days._2_2_ = in_stack_ffffffffffffb12e;
  value_08.days._0_2_ = in_stack_ffffffffffffb12c;
  Value::DATE(value_08);
  local_1060 = (undefined1 **)local_fd8;
  local_106c = (int32_t)date_t::ninfinity();
  value_09.days._2_2_ = in_stack_ffffffffffffb12e;
  value_09.days._0_2_ = in_stack_ffffffffffffb12c;
  Value::DATE(value_09);
  local_1060 = (undefined1 **)local_f98;
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_1060 = (undefined1 **)local_f58;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_10b0,"2022-05-12",&local_10b1);
  local_108c = (int32_t)Date::FromString((string *)in_stack_ffffffffffffb0f8,
                                         (bool)in_stack_ffffffffffffb0f7);
  value_10.days._2_2_ = in_stack_ffffffffffffb12e;
  value_10.days._0_2_ = in_stack_ffffffffffffb12c;
  Value::DATE(value_10);
  local_10b2 = 0;
  local_f18 = (undefined1 **)local_1058;
  local_f10 = 5;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x142182c);
  iVar3._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar3._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar3,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x142187f);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x142188c);
  local_46e0 = &local_f18;
  do {
    local_46e0 = local_46e0 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_46e0 != local_1058);
  ::std::__cxx11::string::~string(local_10b0);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_10b1);
  LogicalType::~LogicalType((LogicalType *)0x1421907);
  LogicalType::~LogicalType((LogicalType *)0x1421914);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[11],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [11])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  LogicalType::LIST((LogicalType *)
                    CONCAT17(in_stack_ffffffffffffb13f,
                             CONCAT16(in_stack_ffffffffffffb13e,
                                      CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138))
                            ));
  LogicalType::~LogicalType((LogicalType *)0x142197a);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_1158 = 0;
  uStack_1150 = 0;
  local_1148 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x14219ba);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14219e6);
  LogicalType::~LogicalType((LogicalType *)0x14219f3);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_137a = 1;
  local_1320 = (undefined1 **)local_1318;
  local_1328 = 0;
  value.value._4_2_ = in_stack_ffffffffffffb12c;
  value.value._0_4_ = in_stack_ffffffffffffb128;
  value.value._6_2_ = in_stack_ffffffffffffb12e;
  Value::TIMESTAMP(value);
  local_1320 = (undefined1 **)local_12d8;
  local_1330 = (int64_t)timestamp_t::infinity();
  value_00.value._4_2_ = in_stack_ffffffffffffb12c;
  value_00.value._0_4_ = in_stack_ffffffffffffb128;
  value_00.value._6_2_ = in_stack_ffffffffffffb12e;
  Value::TIMESTAMP(value_00);
  local_1320 = (undefined1 **)local_1298;
  local_1338 = (int64_t)timestamp_t::ninfinity();
  value_01.value._4_2_ = in_stack_ffffffffffffb12c;
  value_01.value._0_4_ = in_stack_ffffffffffffb128;
  value_01.value._6_2_ = in_stack_ffffffffffffb12e;
  Value::TIMESTAMP(value_01);
  local_1320 = (undefined1 **)local_1258;
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_1320 = (undefined1 **)local_1218;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1378,"2022-05-12 16:23:45",&local_1379);
  local_1358 = (int64_t)Timestamp::FromString((string *)in_stack_ffffffffffffb0f8);
  value_02.value._4_2_ = in_stack_ffffffffffffb12c;
  value_02.value._0_4_ = in_stack_ffffffffffffb128;
  value_02.value._6_2_ = in_stack_ffffffffffffb12e;
  Value::TIMESTAMP(value_02);
  local_137a = 0;
  local_11d8 = (undefined1 **)local_1318;
  local_11d0 = 5;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1421bdb);
  iVar4._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar4._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar4,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1421c2e);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1421c3b);
  local_4748 = &local_11d8;
  do {
    local_4748 = local_4748 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4748 != local_1318);
  ::std::__cxx11::string::~string(local_1378);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1379);
  LogicalType::~LogicalType((LogicalType *)0x1421cb6);
  LogicalType::~LogicalType((LogicalType *)0x1421cc3);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[16],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [16])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  LogicalType::LIST((LogicalType *)
                    CONCAT17(in_stack_ffffffffffffb13f,
                             CONCAT16(in_stack_ffffffffffffb13e,
                                      CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138))
                            ));
  LogicalType::~LogicalType((LogicalType *)0x1421d29);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_1428 = 0;
  uStack_1420 = 0;
  local_1418 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1421d69);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1421d95);
  LogicalType::~LogicalType((LogicalType *)0x1421da2);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_1662 = 1;
  local_15f0 = (undefined1 **)local_15e8;
  local_15f8 = 0;
  value_03.super_timestamp_t.value._4_2_ = in_stack_ffffffffffffb12c;
  value_03.super_timestamp_t.value._0_4_ = in_stack_ffffffffffffb128;
  value_03.super_timestamp_t.value._6_2_ = in_stack_ffffffffffffb12e;
  Value::TIMESTAMPTZ(value_03);
  local_15f0 = (undefined1 **)local_15a8;
  local_1608 = (int64_t)timestamp_t::infinity();
  timestamp_tz_t::timestamp_tz_t(&local_1600,(timestamp_t)local_1608);
  value_04.super_timestamp_t.value._4_2_ = in_stack_ffffffffffffb12c;
  value_04.super_timestamp_t.value._0_4_ = in_stack_ffffffffffffb128;
  value_04.super_timestamp_t.value._6_2_ = in_stack_ffffffffffffb12e;
  Value::TIMESTAMPTZ(value_04);
  local_15f0 = (undefined1 **)local_1568;
  local_1618 = (int64_t)timestamp_t::ninfinity();
  timestamp_tz_t::timestamp_tz_t(&local_1610,(timestamp_t)local_1618);
  value_05.super_timestamp_t.value._4_2_ = in_stack_ffffffffffffb12c;
  value_05.super_timestamp_t.value._0_4_ = in_stack_ffffffffffffb128;
  value_05.super_timestamp_t.value._6_2_ = in_stack_ffffffffffffb12e;
  Value::TIMESTAMPTZ(value_05);
  local_15f0 = (undefined1 **)local_1528;
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_15f0 = (undefined1 **)local_14e8;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_1660,"2022-05-12 16:23:45-07",&local_1661);
  local_1640 = (int64_t)Timestamp::FromString((string *)in_stack_ffffffffffffb0f8);
  timestamp_tz_t::timestamp_tz_t(local_1638,(timestamp_t)local_1640);
  value_06.super_timestamp_t.value._4_2_ = in_stack_ffffffffffffb12c;
  value_06.super_timestamp_t.value._0_4_ = in_stack_ffffffffffffb128;
  value_06.super_timestamp_t.value._6_2_ = in_stack_ffffffffffffb12e;
  Value::TIMESTAMPTZ(value_06);
  local_1662 = 0;
  local_14a8 = (undefined1 **)local_15e8;
  local_14a0 = 5;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1421fcf);
  iVar5._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar5._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar5,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1422022);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x142202f);
  local_47b0 = &local_14a8;
  do {
    local_47b0 = local_47b0 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_47b0 != local_15e8);
  ::std::__cxx11::string::~string(local_1660);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_1661);
  LogicalType::~LogicalType((LogicalType *)0x14220aa);
  LogicalType::~LogicalType((LogicalType *)0x14220b7);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[18],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [18])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  LogicalType::LIST((LogicalType *)
                    CONCAT17(in_stack_ffffffffffffb13f,
                             CONCAT16(in_stack_ffffffffffffb13e,
                                      CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138))
                            ));
  LogicalType::~LogicalType((LogicalType *)0x142211d);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_1708 = 0;
  uStack_1700 = 0;
  local_16f8 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x142215d);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1422189);
  LogicalType::~LogicalType((LogicalType *)0x1422196);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_18a9 = 1;
  local_1890 = (undefined1 **)local_1888;
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  local_1890 = (undefined1 **)local_1848;
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  local_1890 = (undefined1 **)local_1808;
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_1890 = (undefined1 **)local_17c8;
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  local_18a9 = 0;
  local_1788 = (undefined1 **)local_1888;
  local_1780 = 4;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1422288);
  iVar6._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar6._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar6,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14222db);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x14222e8);
  local_47e0 = &local_1788;
  do {
    local_47e0 = local_47e0 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_47e0 != local_1888);
  LogicalType::~LogicalType((LogicalType *)0x1422349);
  LogicalType::~LogicalType((LogicalType *)0x1422356);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[14],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [14])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LIST((LogicalType *)
                    CONCAT17(in_stack_ffffffffffffb13f,
                             CONCAT16(in_stack_ffffffffffffb13e,
                                      CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138))
                            ));
  local_1928 = 0;
  uStack_1920 = 0;
  local_1918 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x14223c7);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14223f3);
  local_1af1 = 1;
  local_1ad8 = (undefined1 **)local_1ad0;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_1ad8 = (undefined1 **)local_1a90;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_1ad8 = (undefined1 **)local_1a50;
  LogicalType::LogicalType
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
             (LogicalType *)in_stack_ffffffffffffb0e8);
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_1ad8 = (undefined1 **)local_1a10;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_1ad8 = (undefined1 **)local_19d0;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_1af1 = 0;
  local_1990 = (undefined1 **)local_1ad0;
  local_1988 = 5;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x14224f6);
  iVar7._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar7._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar7,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1422549);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1422556);
  local_4810 = &local_1990;
  do {
    local_4810 = local_4810 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4810 != local_1ad0);
  LogicalType::~LogicalType((LogicalType *)0x14225b7);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[17],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [17])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)0x14225f2);
  pVar28 = ::std::make_pair<char_const(&)[2],duckdb::LogicalTypeId_const&>
                     ((char (*) [2])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
                      (LogicalTypeId *)in_stack_ffffffffffffb0e8);
  local_1b68 = pVar28.first;
  local_1b60 = pVar28.second;
  local_1b58 = local_1b68;
  local_1b50 = local_1b60;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)in_stack_ffffffffffffb120,
             (pair<const_char_*,_duckdb::LogicalTypeId> *)in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              (value_type *)in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  pVar28 = ::std::make_pair<char_const(&)[2],duckdb::LogicalTypeId_const&>
                     ((char (*) [2])CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
                      (LogicalTypeId *)in_stack_ffffffffffffb0e8);
  local_1bc0 = pVar28.first;
  local_1bb8 = pVar28.second;
  local_1bb0 = local_1bc0;
  local_1ba8 = local_1bb8;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)in_stack_ffffffffffffb120,
             (pair<const_char_*,_duckdb::LogicalTypeId> *)in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              (value_type *)in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)in_stack_ffffffffffffb0e8);
  LogicalType::STRUCT((child_list_t<LogicalType> *)
                      CONCAT17(in_stack_ffffffffffffb13f,
                               CONCAT16(in_stack_ffffffffffffb13e,
                                        CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138
                                                ))));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x1422763);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)0x1422770);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  ::std::make_pair<char_const(&)[2],duckdb::Value>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x1422801);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x142281b);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  ::std::make_pair<char_const(&)[2],duckdb::Value>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x14228ac);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14228c6);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)in_stack_ffffffffffffb0e8);
  Value::STRUCT(in_stack_ffffffffffffb1f8);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1422907);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)0x1422914);
  Value::INTEGER(CONCAT22(in_stack_ffffffffffffb12e,in_stack_ffffffffffffb12c));
  ::std::make_pair<char_const(&)[2],duckdb::Value>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x142298e);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  ::std::make_pair<char_const(&)[2],duckdb::Value>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x1422a17);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)in_stack_ffffffffffffb0e8);
  Value::STRUCT(in_stack_ffffffffffffb1f8);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1422a65);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[7],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [7])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)0x1422aa0);
  ::std::make_pair<char_const(&)[2],duckdb::LogicalType&>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalType,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)in_stack_ffffffffffffb120,
             (pair<const_char_*,_duckdb::LogicalType> *)in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              (value_type *)in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::LogicalType>::~pair
            ((pair<const_char_*,_duckdb::LogicalType> *)0x1422b06);
  ::std::make_pair<char_const(&)[2],duckdb::LogicalType&>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalType,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)in_stack_ffffffffffffb120,
             (pair<const_char_*,_duckdb::LogicalType> *)in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              (value_type *)in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::LogicalType>::~pair
            ((pair<const_char_*,_duckdb::LogicalType> *)0x1422b6c);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)in_stack_ffffffffffffb0e8);
  LogicalType::STRUCT((child_list_t<LogicalType> *)
                      CONCAT17(in_stack_ffffffffffffb13f,
                               CONCAT16(in_stack_ffffffffffffb13e,
                                        CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138
                                                ))));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x1422ba7);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)0x1422bb4);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
             (LogicalType *)in_stack_ffffffffffffb0e8);
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  ::std::make_pair<char_const(&)[2],duckdb::Value>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x1422c48);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1422c62);
  LogicalType::LogicalType
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
             (LogicalType *)in_stack_ffffffffffffb0e8);
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  ::std::make_pair<char_const(&)[2],duckdb::Value>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x1422cf6);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1422d10);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)in_stack_ffffffffffffb0e8);
  Value::STRUCT(in_stack_ffffffffffffb1f8);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1422d51);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)0x1422d5e);
  ::std::make_pair<char_const(&)[2],duckdb::Value&>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x1422dc4);
  ::std::make_pair<char_const(&)[2],duckdb::Value&>
            ((char (*) [2])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x1422e2a);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)in_stack_ffffffffffffb0e8);
  Value::STRUCT(in_stack_ffffffffffffb1f8);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1422e6b);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[17],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [17])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LIST((LogicalType *)
                    CONCAT17(in_stack_ffffffffffffb13f,
                             CONCAT16(in_stack_ffffffffffffb13e,
                                      CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138))
                            ));
  local_2638 = 0;
  uStack_2630 = 0;
  local_2628 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1422edc);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1422f08);
  local_2781 = 1;
  local_2768 = (undefined1 **)local_2760;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_2768 = (undefined1 **)local_2720;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_2768 = (undefined1 **)local_26e0;
  LogicalType::LogicalType
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
             (LogicalType *)in_stack_ffffffffffffb0e8);
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_2781 = 0;
  local_26a0 = (undefined1 **)local_2760;
  local_2698 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1422fcd);
  iVar8._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar8._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar8,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1423020);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x142302d);
  local_4880 = &local_26a0;
  do {
    local_4880 = local_4880 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4880 != local_2760);
  LogicalType::~LogicalType((LogicalType *)0x142308e);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[17],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [17])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  LogicalType::MAP((LogicalType *)in_stack_ffffffffffffb168,in_stack_ffffffffffffb160);
  LogicalType::~LogicalType((LogicalType *)0x1423110);
  LogicalType::~LogicalType((LogicalType *)0x142311d);
  ListType::GetChildType
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  local_2828 = 0;
  uStack_2820 = 0;
  local_2818 = 0;
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1423160);
  Value::MAP(in_stack_ffffffffffffb238,in_stack_ffffffffffffb230);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x142318c);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)0x1423199);
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  ::std::make_pair<char_const(&)[4],duckdb::Value>
            ((char (*) [4])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x1423215);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  ::std::make_pair<char_const(&)[6],duckdb::Value>
            ((char (*) [6])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x142329e);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)0x14232b8);
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  ::std::make_pair<char_const(&)[4],duckdb::Value>
            ((char (*) [4])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x1423334);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  ::std::make_pair<char_const(&)[6],duckdb::Value>
            ((char (*) [6])in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_*,_duckdb::Value,_true>(in_stack_ffffffffffffb120,in_stack_ffffffffffffb118);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::push_back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
               *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
              in_stack_ffffffffffffb0e8);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
           *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  ::std::pair<const_char_*,_duckdb::Value>::~pair((pair<const_char_*,_duckdb::Value> *)0x14233bd);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x14233d7);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)in_stack_ffffffffffffb0e8);
  Value::STRUCT(in_stack_ffffffffffffb1f8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
             (value_type *)in_stack_ffffffffffffb0e8);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1423436);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)in_stack_ffffffffffffb0e8);
  Value::STRUCT(in_stack_ffffffffffffb1f8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
             (value_type *)in_stack_ffffffffffffb0e8);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1423495);
  ListType::GetChildType
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
             (vector<duckdb::Value,_true> *)in_stack_ffffffffffffb0e8);
  Value::MAP(in_stack_ffffffffffffb238,in_stack_ffffffffffffb230);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14234ef);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[4],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [4])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  local_2db8 = (undefined1 **)local_2db0;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[5],_const_duckdb::LogicalTypeId_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)in_stack_ffffffffffffb130,
             (char (*) [5])
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
             (LogicalTypeId *)in_stack_ffffffffffffb120);
  local_2db8 = (undefined1 **)local_2d78;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)in_stack_ffffffffffffb130,
             (char (*) [4])
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
             (LogicalTypeId *)in_stack_ffffffffffffb120);
  local_2d40 = (undefined1 **)local_2db0;
  local_2d38 = 2;
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
               *)0x1423598);
  iVar9._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar9._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar9,
           (allocator_type *)in_stack_ffffffffffffb0e8);
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
                *)0x14235cc);
  local_48b8 = &local_2d40;
  do {
    local_48b8 = local_48b8 + -7;
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
             *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_48b8 != local_2db0);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)in_stack_ffffffffffffb0e8);
  LogicalType::UNION(in_stack_ffffffffffffb198);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x1423659);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)in_stack_ffffffffffffb0e8);
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  Value::UNION(in_stack_ffffffffffffb218,in_stack_ffffffffffffb217,in_stack_ffffffffffffb208);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x14236c1);
  local_2df8 = local_2e38;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
           (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)in_stack_ffffffffffffb0e8);
  Value::SMALLINT(in_stack_ffffffffffffb12e);
  Value::UNION(in_stack_ffffffffffffb218,in_stack_ffffffffffffb217,in_stack_ffffffffffffb208);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x142373a);
  local_2e98 = local_2ed8;
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[6],duckdb::Value_const&,duckdb::Value_const&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [6])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  optional_idx::optional_idx
            ((optional_idx *)in_stack_ffffffffffffb130,
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  LogicalType::ARRAY(&in_stack_ffffffffffffb170->type_,in_stack_ffffffffffffb178);
  LogicalType::~LogicalType((LogicalType *)0x14237cc);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_30c9 = 1;
  local_30b0 = (undefined1 **)local_30a8;
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_30b0 = (undefined1 **)local_3068;
  Value::Value(in_stack_ffffffffffffb110,in_stack_ffffffffffffb10c);
  local_30b0 = (undefined1 **)local_3028;
  Value::Value(in_stack_ffffffffffffb110,in_stack_ffffffffffffb10c);
  local_30c9 = 0;
  local_2fe8 = (undefined1 **)local_30a8;
  local_2fe0 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1423894);
  iVar10._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar10._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar10,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14238e7);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x14238f4);
  local_48d8 = &local_2fe8;
  do {
    local_48d8 = local_48d8 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_48d8 != local_30a8);
  LogicalType::~LogicalType((LogicalType *)0x1423955);
  LogicalType::~LogicalType((LogicalType *)0x1423962);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_3218 = (undefined1 **)local_3210;
  Value::Value(in_stack_ffffffffffffb110,in_stack_ffffffffffffb10c);
  local_3218 = (undefined1 **)local_31d0;
  Value::Value(in_stack_ffffffffffffb110,in_stack_ffffffffffffb10c);
  local_3218 = (undefined1 **)local_3190;
  Value::Value(in_stack_ffffffffffffb110,in_stack_ffffffffffffb10c);
  local_3150 = (undefined1 **)local_3210;
  local_3148 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x14239fb);
  iVar11._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar11._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar11,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1423a4e);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1423a5b);
  local_48f8 = &local_3150;
  do {
    local_48f8 = local_48f8 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_48f8 != local_3210);
  LogicalType::~LogicalType((LogicalType *)0x1423abc);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[16],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [16])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  optional_idx::optional_idx
            ((optional_idx *)in_stack_ffffffffffffb130,
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  LogicalType::ARRAY(&in_stack_ffffffffffffb170->type_,in_stack_ffffffffffffb178);
  LogicalType::~LogicalType((LogicalType *)0x1423b3e);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_33b9 = 1;
  local_33a0 = (undefined1 **)local_3398;
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  local_33a0 = (undefined1 **)local_3358;
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_33a0 = (undefined1 **)local_3318;
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  local_33b9 = 0;
  local_32d8 = (undefined1 **)local_3398;
  local_32d0 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1423c12);
  iVar12._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar12._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar12,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1423c65);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1423c72);
  local_4920 = &local_32d8;
  do {
    local_4920 = local_4920 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4920 != local_3398);
  LogicalType::~LogicalType((LogicalType *)0x1423cd3);
  LogicalType::~LogicalType((LogicalType *)0x1423ce0);
  LogicalType::LogicalType
            (&in_stack_ffffffffffffb110->type_,
             (LogicalTypeId)((uint)in_stack_ffffffffffffb10c >> 0x18));
  local_3508 = (undefined1 **)local_3500;
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  local_3508 = (undefined1 **)local_34c0;
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  local_3508 = (undefined1 **)local_3480;
  Value::Value(in_stack_ffffffffffffb140,
               (char *)CONCAT17(in_stack_ffffffffffffb13f,
                                CONCAT16(in_stack_ffffffffffffb13e,
                                         CONCAT24(in_stack_ffffffffffffb13c,
                                                  in_stack_ffffffffffffb138))));
  local_3440 = (undefined1 **)local_3500;
  local_3438 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1423d7f);
  iVar13._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar13._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar13,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1423dd2);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1423ddf);
  local_4940 = &local_3440;
  do {
    local_4940 = local_4940 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4940 != local_3500);
  LogicalType::~LogicalType((LogicalType *)0x1423e40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[20],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [20])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  optional_idx::optional_idx
            ((optional_idx *)in_stack_ffffffffffffb130,
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  LogicalType::ARRAY(&in_stack_ffffffffffffb170->type_,in_stack_ffffffffffffb178);
  local_3679 = 1;
  local_3660 = (undefined1 **)local_3658;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3660 = (undefined1 **)local_3618;
  LogicalType::LogicalType
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
             (LogicalType *)in_stack_ffffffffffffb0e8);
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_3660 = (undefined1 **)local_35d8;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3679 = 0;
  local_3598 = (undefined1 **)local_3658;
  local_3590 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1423f66);
  iVar14._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar14._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar14,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1423fb9);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1423fc6);
  local_4968 = &local_3598;
  do {
    local_4968 = local_4968 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4968 != local_3658);
  LogicalType::~LogicalType((LogicalType *)0x1424027);
  local_37b0 = (undefined1 **)local_37a8;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_37b0 = (undefined1 **)local_3768;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_37b0 = (undefined1 **)local_3728;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_36e8 = (undefined1 **)local_37a8;
  local_36e0 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x14240b5);
  iVar15._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar15._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar15,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1424108);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1424115);
  local_4988 = &local_36e8;
  do {
    local_4988 = local_4988 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4988 != local_37a8);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[23],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [23])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  optional_idx::optional_idx
            ((optional_idx *)in_stack_ffffffffffffb130,
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  LogicalType::ARRAY(&in_stack_ffffffffffffb170->type_,in_stack_ffffffffffffb178);
  local_3921 = 1;
  local_3908 = (undefined1 **)local_3900;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3908 = (undefined1 **)local_38c0;
  LogicalType::LogicalType
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),
             (LogicalType *)in_stack_ffffffffffffb0e8);
  Value::Value((Value *)in_stack_ffffffffffffb100,(LogicalType *)in_stack_ffffffffffffb0f8);
  local_3908 = (undefined1 **)local_3880;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3921 = 0;
  local_3840 = (undefined1 **)local_3900;
  local_3838 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x142428f);
  iVar16._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar16._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar16,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14242e2);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x14242ef);
  local_49b0 = &local_3840;
  do {
    local_49b0 = local_49b0 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_49b0 != local_3900);
  LogicalType::~LogicalType((LogicalType *)0x1424350);
  local_3a58 = (undefined1 **)local_3a50;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3a58 = (undefined1 **)local_3a10;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3a58 = (undefined1 **)local_39d0;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3990 = (undefined1 **)local_3a50;
  local_3988 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x14243de);
  iVar17._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar17._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar17,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1424431);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x142443e);
  local_49d0 = &local_3990;
  do {
    local_49d0 = local_49d0 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_49d0 != local_3a50);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[27],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [27])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  optional_idx::optional_idx
            ((optional_idx *)in_stack_ffffffffffffb130,
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  LogicalType::ARRAY(&in_stack_ffffffffffffb170->type_,in_stack_ffffffffffffb178);
  local_3bb0 = (undefined1 **)local_3ba8;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3bb0 = (undefined1 **)local_3b68;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3bb0 = (undefined1 **)local_3b28;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3ae8 = (undefined1 **)local_3ba8;
  local_3ae0 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1424581);
  iVar18._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar18._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar18,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x14245d4);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x14245e1);
  local_49f0 = &local_3ae8;
  do {
    local_49f0 = local_49f0 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_49f0 != local_3ba8);
  local_3ce8 = (undefined1 **)local_3ce0;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3ce8 = (undefined1 **)local_3ca0;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3ce8 = (undefined1 **)local_3c60;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_3c20 = (undefined1 **)local_3ce0;
  local_3c18 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x14246c3);
  iVar19._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar19._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar19,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1424716);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1424723);
  local_4a10 = &local_3c20;
  do {
    local_4a10 = local_4a10 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4a10 != local_3ce0);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[19],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [19])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  local_3da8 = (undefined1 **)local_3da0;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[2],_duckdb::LogicalType_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)in_stack_ffffffffffffb130,
             (char (*) [2])
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
             (LogicalType *)in_stack_ffffffffffffb120);
  local_3da8 = (undefined1 **)local_3d68;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[2],_duckdb::LogicalType_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)in_stack_ffffffffffffb130,
             (char (*) [2])
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
             (LogicalType *)in_stack_ffffffffffffb120);
  local_3d30 = (undefined1 **)local_3da0;
  local_3d28 = 2;
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
               *)0x1424822);
  iVar20._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar20._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar20,
           (allocator_type *)in_stack_ffffffffffffb0e8);
  LogicalType::STRUCT((child_list_t<LogicalType> *)
                      CONCAT17(in_stack_ffffffffffffb13f,
                               CONCAT16(in_stack_ffffffffffffb13e,
                                        CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138
                                                ))));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x142486d);
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
                *)0x142487a);
  local_4a30 = &local_3d30;
  do {
    local_4a30 = local_4a30 + -7;
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
             *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4a30 != local_3da0);
  local_3ee0 = (undefined1 **)local_3ed8;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)in_stack_ffffffffffffb130,
             (char (*) [2])
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
             (Value *)in_stack_ffffffffffffb120);
  local_3ee0 = (undefined1 **)local_3e78;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)in_stack_ffffffffffffb130,
             (char (*) [2])
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
             (Value *)in_stack_ffffffffffffb120);
  local_3e18 = (undefined1 **)local_3ed8;
  local_3e10 = 2;
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
               *)0x1424949);
  iVar21._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar21._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar21,
           (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::STRUCT(in_stack_ffffffffffffb1f8);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1424994);
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
                *)0x14249a1);
  local_4a50 = &local_3e18;
  do {
    local_4a50 = local_4a50 + -0xc;
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
             *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4a50 != local_3ed8);
  local_4018 = (undefined1 **)local_4010;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)in_stack_ffffffffffffb130,
             (char (*) [2])
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
             (Value *)in_stack_ffffffffffffb120);
  local_4018 = (undefined1 **)local_3fb0;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)in_stack_ffffffffffffb130,
             (char (*) [2])
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)),
             (Value *)in_stack_ffffffffffffb120);
  local_3f50 = (undefined1 **)local_4010;
  local_3f48 = 2;
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
               *)0x1424a72);
  iVar22._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar22._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
            *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar22,
           (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::STRUCT(in_stack_ffffffffffffb1f8);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1424abd);
  ::std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
                *)0x1424aca);
  local_4a70 = &local_3f50;
  do {
    local_4a70 = local_4a70 + -0xc;
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
             *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4a70 != local_4010);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[22],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [22])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  optional_idx::optional_idx
            ((optional_idx *)in_stack_ffffffffffffb130,
             CONCAT26(in_stack_ffffffffffffb12e,
                      CONCAT24(in_stack_ffffffffffffb12c,in_stack_ffffffffffffb128)));
  LogicalType::ARRAY(&in_stack_ffffffffffffb170->type_,in_stack_ffffffffffffb178);
  local_4170 = (undefined1 **)local_4168;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_4170 = (undefined1 **)local_4128;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_4170 = (undefined1 **)local_40e8;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_40a8 = (undefined1 **)local_4168;
  local_40a0 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1424c0d);
  iVar23._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar23._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar23,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1424c60);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1424c6d);
  local_4a90 = &local_40a8;
  do {
    local_4a90 = local_4a90 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4a90 != local_4168);
  local_42a8 = (undefined1 **)local_42a0;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_42a8 = (undefined1 **)local_4260;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_42a8 = (undefined1 **)local_4220;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_41e0 = (undefined1 **)local_42a0;
  local_41d8 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1424d4f);
  iVar24._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar24._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar24,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::ARRAY(in_stack_ffffffffffffb1d8,in_stack_ffffffffffffb1d0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1424da2);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1424daf);
  local_4ab0 = &local_41e0;
  do {
    local_4ab0 = local_4ab0 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4ab0 != local_42a0);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[24],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [24])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::LIST((LogicalType *)
                    CONCAT17(in_stack_ffffffffffffb13f,
                             CONCAT16(in_stack_ffffffffffffb13e,
                                      CONCAT24(in_stack_ffffffffffffb13c,in_stack_ffffffffffffb138))
                            ));
  local_43f8 = (undefined1 **)local_43f0;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_43f8 = (undefined1 **)local_43b0;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_43f8 = (undefined1 **)local_4370;
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_4330 = (undefined1 **)local_43f0;
  local_4328 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1424ed6);
  iVar25._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar25._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar25,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1424f29);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1424f36);
  local_4ad0 = &local_4330;
  do {
    local_4ad0 = local_4ad0 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4ad0 != local_43f0);
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  Value::Value((Value *)in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8);
  local_4468 = (undefined1 **)local_4528;
  local_4460 = 3;
  ::std::allocator<duckdb::Value>::allocator((allocator<duckdb::Value> *)0x1425018);
  iVar26._M_len = (size_type)in_stack_ffffffffffffb100;
  iVar26._M_array = (iterator)in_stack_ffffffffffffb0f8;
  vector<duckdb::Value,_true>::vector
            ((vector<duckdb::Value,_true> *)
             CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0),iVar26,
             (allocator_type *)in_stack_ffffffffffffb0e8);
  Value::LIST(in_stack_ffffffffffffb1c8,in_stack_ffffffffffffb1c0);
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x142506b);
  ::std::allocator<duckdb::Value>::~allocator((allocator<duckdb::Value> *)0x1425078);
  local_4af0 = &local_4468;
  do {
    local_4af0 = local_4af0 + -8;
    Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  } while (local_4af0 != local_4528);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[24],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,_std::allocator<duckdb::TestType>_> *)
             in_stack_ffffffffffffb110,
             (LogicalType *)CONCAT44(in_stack_ffffffffffffb10c,in_stack_ffffffffffffb108),
             (char (*) [24])in_stack_ffffffffffffb100,(Value *)in_stack_ffffffffffffb0f8,
             (Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  local_a = 1;
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1425129);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1425150);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1425177);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x142519e);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14251c5);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14251ec);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1425213);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x142523a);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1425261);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x142526e);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1425288);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1425295);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x14252a2);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14252bc);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14252e3);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x14252fd);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1425317);
  LogicalType::~LogicalType((LogicalType *)0x1425324);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x1425331);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x142534b);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>
             *)0x1425365);
  LogicalType::~LogicalType((LogicalType *)0x1425372);
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             *)0x142537f);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14253a6);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14253cd);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x14253f4);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x142541b);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1425442);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1425469);
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Value::~Value((Value *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  LogicalType::~LogicalType((LogicalType *)0x1425490);
  Vector::~Vector((Vector *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  Vector::~Vector((Vector *)CONCAT17(in_stack_ffffffffffffb0f7,in_stack_ffffffffffffb0f0));
  if ((local_a & 1) == 0) {
    vector<duckdb::TestType,_true>::~vector((vector<duckdb::TestType,_true> *)0x1428749);
  }
  return in_RDI;
}

Assistant:

vector<TestType> TestAllTypesFun::GetTestTypes(bool use_large_enum) {
	vector<TestType> result;
	// scalar types/numerics
	result.emplace_back(LogicalType::BOOLEAN, "bool");
	result.emplace_back(LogicalType::TINYINT, "tinyint");
	result.emplace_back(LogicalType::SMALLINT, "smallint");
	result.emplace_back(LogicalType::INTEGER, "int");
	result.emplace_back(LogicalType::BIGINT, "bigint");
	result.emplace_back(LogicalType::HUGEINT, "hugeint");
	result.emplace_back(LogicalType::UHUGEINT, "uhugeint");
	result.emplace_back(LogicalType::UTINYINT, "utinyint");
	result.emplace_back(LogicalType::USMALLINT, "usmallint");
	result.emplace_back(LogicalType::UINTEGER, "uint");
	result.emplace_back(LogicalType::UBIGINT, "ubigint");
	result.emplace_back(LogicalType::VARINT, "varint");
	result.emplace_back(LogicalType::DATE, "date");
	result.emplace_back(LogicalType::TIME, "time");
	result.emplace_back(LogicalType::TIMESTAMP, "timestamp");
	result.emplace_back(LogicalType::TIMESTAMP_S, "timestamp_s");
	result.emplace_back(LogicalType::TIMESTAMP_MS, "timestamp_ms");
	result.emplace_back(LogicalType::TIMESTAMP_NS, "timestamp_ns");
	result.emplace_back(LogicalType::TIME_TZ, "time_tz");
	result.emplace_back(LogicalType::TIMESTAMP_TZ, "timestamp_tz");
	result.emplace_back(LogicalType::FLOAT, "float");
	result.emplace_back(LogicalType::DOUBLE, "double");
	result.emplace_back(LogicalType::DECIMAL(4, 1), "dec_4_1");
	result.emplace_back(LogicalType::DECIMAL(9, 4), "dec_9_4");
	result.emplace_back(LogicalType::DECIMAL(18, 6), "dec_18_6");
	result.emplace_back(LogicalType::DECIMAL(38, 10), "dec38_10");
	result.emplace_back(LogicalType::UUID, "uuid");

	// interval
	interval_t min_interval;
	min_interval.months = 0;
	min_interval.days = 0;
	min_interval.micros = 0;

	interval_t max_interval;
	max_interval.months = 999;
	max_interval.days = 999;
	max_interval.micros = 999999999;
	result.emplace_back(LogicalType::INTERVAL, "interval", Value::INTERVAL(min_interval),
	                    Value::INTERVAL(max_interval));
	// strings/blobs/bitstrings
	result.emplace_back(LogicalType::VARCHAR, "varchar", Value("🦆🦆🦆🦆🦆🦆"),
	                    Value(string("goo\x00se", 6)));
	result.emplace_back(LogicalType::BLOB, "blob", Value::BLOB("thisisalongblob\\x00withnullbytes"),
	                    Value::BLOB("\\x00\\x00\\x00a"));
	result.emplace_back(LogicalType::BIT, "bit", Value::BIT("0010001001011100010101011010111"), Value::BIT("10101"));

	// enums
	Vector small_enum(LogicalType::VARCHAR, 2);
	auto small_enum_ptr = FlatVector::GetData<string_t>(small_enum);
	small_enum_ptr[0] = StringVector::AddStringOrBlob(small_enum, "DUCK_DUCK_ENUM");
	small_enum_ptr[1] = StringVector::AddStringOrBlob(small_enum, "GOOSE");
	result.emplace_back(LogicalType::ENUM(small_enum, 2), "small_enum");

	Vector medium_enum(LogicalType::VARCHAR, 300);
	auto medium_enum_ptr = FlatVector::GetData<string_t>(medium_enum);
	for (idx_t i = 0; i < 300; i++) {
		medium_enum_ptr[i] = StringVector::AddStringOrBlob(medium_enum, string("enum_") + to_string(i));
	}
	result.emplace_back(LogicalType::ENUM(medium_enum, 300), "medium_enum");

	if (use_large_enum) {
		// this is a big one... not sure if we should push this one here, but it's required for completeness
		Vector large_enum(LogicalType::VARCHAR, 70000);
		auto large_enum_ptr = FlatVector::GetData<string_t>(large_enum);
		for (idx_t i = 0; i < 70000; i++) {
			large_enum_ptr[i] = StringVector::AddStringOrBlob(large_enum, string("enum_") + to_string(i));
		}
		result.emplace_back(LogicalType::ENUM(large_enum, 70000), "large_enum");
	} else {
		Vector large_enum(LogicalType::VARCHAR, 2);
		auto large_enum_ptr = FlatVector::GetData<string_t>(large_enum);
		large_enum_ptr[0] = StringVector::AddStringOrBlob(large_enum, string("enum_") + to_string(0));
		large_enum_ptr[1] = StringVector::AddStringOrBlob(large_enum, string("enum_") + to_string(69999));
		result.emplace_back(LogicalType::ENUM(large_enum, 2), "large_enum");
	}

	// arrays
	auto int_list_type = LogicalType::LIST(LogicalType::INTEGER);
	auto empty_int_list = Value::LIST(LogicalType::INTEGER, vector<Value>());
	auto int_list =
	    Value::LIST(LogicalType::INTEGER, {Value::INTEGER(42), Value::INTEGER(999), Value(LogicalType::INTEGER),
	                                       Value(LogicalType::INTEGER), Value::INTEGER(-42)});
	result.emplace_back(int_list_type, "int_array", empty_int_list, int_list);

	auto double_list_type = LogicalType::LIST(LogicalType::DOUBLE);
	auto empty_double_list = Value::LIST(LogicalType::DOUBLE, vector<Value>());
	auto double_list = Value::LIST(LogicalType::DOUBLE, {Value::DOUBLE(42), Value::DOUBLE(NAN),
	                                                     Value::DOUBLE(std::numeric_limits<double>::infinity()),
	                                                     Value::DOUBLE(-std::numeric_limits<double>::infinity()),
	                                                     Value(LogicalType::DOUBLE), Value::DOUBLE(-42)});
	result.emplace_back(double_list_type, "double_array", empty_double_list, double_list);

	auto date_list_type = LogicalType::LIST(LogicalType::DATE);
	auto empty_date_list = Value::LIST(LogicalType::DATE, vector<Value>());
	auto date_list = Value::LIST(LogicalType::DATE, {Value::DATE(date_t()), Value::DATE(date_t::infinity()),
	                                                 Value::DATE(date_t::ninfinity()), Value(LogicalType::DATE),
	                                                 Value::DATE(Date::FromString("2022-05-12"))});
	result.emplace_back(date_list_type, "date_array", empty_date_list, date_list);

	auto timestamp_list_type = LogicalType::LIST(LogicalType::TIMESTAMP);
	auto empty_timestamp_list = Value::LIST(LogicalType::TIMESTAMP, vector<Value>());
	auto timestamp_list =
	    Value::LIST(LogicalType::TIMESTAMP, {Value::TIMESTAMP(timestamp_t()), Value::TIMESTAMP(timestamp_t::infinity()),
	                                         Value::TIMESTAMP(timestamp_t::ninfinity()), Value(LogicalType::TIMESTAMP),
	                                         Value::TIMESTAMP(Timestamp::FromString("2022-05-12 16:23:45"))});
	result.emplace_back(timestamp_list_type, "timestamp_array", empty_timestamp_list, timestamp_list);

	auto timestamptz_list_type = LogicalType::LIST(LogicalType::TIMESTAMP_TZ);
	auto empty_timestamptz_list = Value::LIST(LogicalType::TIMESTAMP_TZ, vector<Value>());
	auto timestamptz_list =
	    Value::LIST(LogicalType::TIMESTAMP_TZ,
	                {Value::TIMESTAMPTZ(timestamp_tz_t()), Value::TIMESTAMPTZ(timestamp_tz_t(timestamp_t::infinity())),
	                 Value::TIMESTAMPTZ(timestamp_tz_t(timestamp_t::ninfinity())), Value(LogicalType::TIMESTAMP_TZ),
	                 Value::TIMESTAMPTZ(timestamp_tz_t(Timestamp::FromString("2022-05-12 16:23:45-07")))});
	result.emplace_back(timestamptz_list_type, "timestamptz_array", empty_timestamptz_list, timestamptz_list);

	auto varchar_list_type = LogicalType::LIST(LogicalType::VARCHAR);
	auto empty_varchar_list = Value::LIST(LogicalType::VARCHAR, vector<Value>());
	auto varchar_list = Value::LIST(LogicalType::VARCHAR, {Value("🦆🦆🦆🦆🦆🦆"), Value("goose"),
	                                                       Value(LogicalType::VARCHAR), Value("")});
	result.emplace_back(varchar_list_type, "varchar_array", empty_varchar_list, varchar_list);

	// nested arrays
	auto nested_list_type = LogicalType::LIST(int_list_type);
	auto empty_nested_list = Value::LIST(int_list_type, vector<Value>());
	auto nested_int_list =
	    Value::LIST(int_list_type, {empty_int_list, int_list, Value(int_list_type), empty_int_list, int_list});
	result.emplace_back(nested_list_type, "nested_int_array", empty_nested_list, nested_int_list);

	// structs
	child_list_t<LogicalType> struct_type_list;
	struct_type_list.push_back(make_pair("a", LogicalType::INTEGER));
	struct_type_list.push_back(make_pair("b", LogicalType::VARCHAR));
	auto struct_type = LogicalType::STRUCT(struct_type_list);

	child_list_t<Value> min_struct_list;
	min_struct_list.push_back(make_pair("a", Value(LogicalType::INTEGER)));
	min_struct_list.push_back(make_pair("b", Value(LogicalType::VARCHAR)));
	auto min_struct_val = Value::STRUCT(std::move(min_struct_list));

	child_list_t<Value> max_struct_list;
	max_struct_list.push_back(make_pair("a", Value::INTEGER(42)));
	max_struct_list.push_back(make_pair("b", Value("🦆🦆🦆🦆🦆🦆")));
	auto max_struct_val = Value::STRUCT(std::move(max_struct_list));

	result.emplace_back(struct_type, "struct", min_struct_val, max_struct_val);

	// structs with lists
	child_list_t<LogicalType> struct_list_type_list;
	struct_list_type_list.push_back(make_pair("a", int_list_type));
	struct_list_type_list.push_back(make_pair("b", varchar_list_type));
	auto struct_list_type = LogicalType::STRUCT(struct_list_type_list);

	child_list_t<Value> min_struct_vl_list;
	min_struct_vl_list.push_back(make_pair("a", Value(int_list_type)));
	min_struct_vl_list.push_back(make_pair("b", Value(varchar_list_type)));
	auto min_struct_val_list = Value::STRUCT(std::move(min_struct_vl_list));

	child_list_t<Value> max_struct_vl_list;
	max_struct_vl_list.push_back(make_pair("a", int_list));
	max_struct_vl_list.push_back(make_pair("b", varchar_list));
	auto max_struct_val_list = Value::STRUCT(std::move(max_struct_vl_list));

	result.emplace_back(struct_list_type, "struct_of_arrays", std::move(min_struct_val_list),
	                    std::move(max_struct_val_list));

	// array of structs
	auto array_of_structs_type = LogicalType::LIST(struct_type);
	auto min_array_of_struct_val = Value::LIST(struct_type, vector<Value>());
	auto max_array_of_struct_val = Value::LIST(struct_type, {min_struct_val, max_struct_val, Value(struct_type)});
	result.emplace_back(array_of_structs_type, "array_of_structs", std::move(min_array_of_struct_val),
	                    std::move(max_array_of_struct_val));

	// map
	auto map_type = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	auto min_map_value = Value::MAP(ListType::GetChildType(map_type), vector<Value>());

	child_list_t<Value> map_struct1;
	map_struct1.push_back(make_pair("key", Value("key1")));
	map_struct1.push_back(make_pair("value", Value("🦆🦆🦆🦆🦆🦆")));
	child_list_t<Value> map_struct2;
	map_struct2.push_back(make_pair("key", Value("key2")));
	map_struct2.push_back(make_pair("value", Value("goose")));

	vector<Value> map_values;
	map_values.push_back(Value::STRUCT(map_struct1));
	map_values.push_back(Value::STRUCT(map_struct2));

	auto max_map_value = Value::MAP(ListType::GetChildType(map_type), map_values);
	result.emplace_back(map_type, "map", std::move(min_map_value), std::move(max_map_value));

	// union
	child_list_t<LogicalType> members = {{"name", LogicalType::VARCHAR}, {"age", LogicalType::SMALLINT}};
	auto union_type = LogicalType::UNION(members);
	const Value &min = Value::UNION(members, 0, Value("Frank"));
	const Value &max = Value::UNION(members, 1, Value::SMALLINT(5));
	result.emplace_back(union_type, "union", min, max);

	// fixed int array
	auto fixed_int_array_type = LogicalType::ARRAY(LogicalType::INTEGER, 3);
	auto fixed_int_min_array_value = Value::ARRAY(LogicalType::INTEGER, {Value(LogicalType::INTEGER), 2, 3});
	auto fixed_int_max_array_value = Value::ARRAY(LogicalType::INTEGER, {4, 5, 6});
	result.emplace_back(fixed_int_array_type, "fixed_int_array", fixed_int_min_array_value, fixed_int_max_array_value);

	// fixed varchar array
	auto fixed_varchar_array_type = LogicalType::ARRAY(LogicalType::VARCHAR, 3);
	auto fixed_varchar_min_array_value =
	    Value::ARRAY(LogicalType::VARCHAR, {Value("a"), Value(LogicalType::VARCHAR), Value("c")});
	auto fixed_varchar_max_array_value = Value::ARRAY(LogicalType::VARCHAR, {Value("d"), Value("e"), Value("f")});
	result.emplace_back(fixed_varchar_array_type, "fixed_varchar_array", fixed_varchar_min_array_value,
	                    fixed_varchar_max_array_value);

	// fixed nested int array
	auto fixed_nested_int_array_type = LogicalType::ARRAY(fixed_int_array_type, 3);
	auto fixed_nested_int_min_array_value = Value::ARRAY(
	    fixed_int_array_type, {fixed_int_min_array_value, Value(fixed_int_array_type), fixed_int_min_array_value});
	auto fixed_nested_int_max_array_value = Value::ARRAY(
	    fixed_int_array_type, {fixed_int_max_array_value, fixed_int_min_array_value, fixed_int_max_array_value});
	result.emplace_back(fixed_nested_int_array_type, "fixed_nested_int_array", fixed_nested_int_min_array_value,
	                    fixed_nested_int_max_array_value);

	// fixed nested varchar array
	auto fixed_nested_varchar_array_type = LogicalType::ARRAY(fixed_varchar_array_type, 3);
	auto fixed_nested_varchar_min_array_value =
	    Value::ARRAY(fixed_varchar_array_type,
	                 {fixed_varchar_min_array_value, Value(fixed_varchar_array_type), fixed_varchar_min_array_value});
	auto fixed_nested_varchar_max_array_value =
	    Value::ARRAY(fixed_varchar_array_type,
	                 {fixed_varchar_max_array_value, fixed_varchar_min_array_value, fixed_varchar_max_array_value});
	result.emplace_back(fixed_nested_varchar_array_type, "fixed_nested_varchar_array",
	                    fixed_nested_varchar_min_array_value, fixed_nested_varchar_max_array_value);

	// fixed array of structs
	auto fixed_struct_array_type = LogicalType::ARRAY(struct_type, 3);
	auto fixed_struct_min_array_value = Value::ARRAY(struct_type, {min_struct_val, max_struct_val, min_struct_val});
	auto fixed_struct_max_array_value = Value::ARRAY(struct_type, {max_struct_val, min_struct_val, max_struct_val});
	result.emplace_back(fixed_struct_array_type, "fixed_struct_array", fixed_struct_min_array_value,
	                    fixed_struct_max_array_value);

	// struct of fixed array
	auto struct_of_fixed_array_type =
	    LogicalType::STRUCT({{"a", fixed_int_array_type}, {"b", fixed_varchar_array_type}});
	auto struct_of_fixed_array_min_value =
	    Value::STRUCT({{"a", fixed_int_min_array_value}, {"b", fixed_varchar_min_array_value}});
	auto struct_of_fixed_array_max_value =
	    Value::STRUCT({{"a", fixed_int_max_array_value}, {"b", fixed_varchar_max_array_value}});
	result.emplace_back(struct_of_fixed_array_type, "struct_of_fixed_array", struct_of_fixed_array_min_value,
	                    struct_of_fixed_array_max_value);

	// fixed array of list of int
	auto fixed_array_of_list_of_int_type = LogicalType::ARRAY(int_list_type, 3);
	auto fixed_array_of_list_of_int_min_value = Value::ARRAY(int_list_type, {empty_int_list, int_list, empty_int_list});
	auto fixed_array_of_list_of_int_max_value = Value::ARRAY(int_list_type, {int_list, empty_int_list, int_list});
	result.emplace_back(fixed_array_of_list_of_int_type, "fixed_array_of_int_list",
	                    fixed_array_of_list_of_int_min_value, fixed_array_of_list_of_int_max_value);

	// list of fixed array of int
	auto list_of_fixed_array_of_int_type = LogicalType::LIST(fixed_int_array_type);
	auto list_of_fixed_array_of_int_min_value = Value::LIST(
	    fixed_int_array_type, {fixed_int_min_array_value, fixed_int_max_array_value, fixed_int_min_array_value});
	auto list_of_fixed_array_of_int_max_value = Value::LIST(
	    fixed_int_array_type, {fixed_int_max_array_value, fixed_int_min_array_value, fixed_int_max_array_value});
	result.emplace_back(list_of_fixed_array_of_int_type, "list_of_fixed_int_array",
	                    list_of_fixed_array_of_int_min_value, list_of_fixed_array_of_int_max_value);

	return result;
}